

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O2

void __thiscall
argparse::ArgumentParser::parse_args_internal
          (ArgumentParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *aArguments)

{
  _Rb_tree_header *p_Var1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  end;
  char *pcVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  const_iterator cVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start;
  ulong uVar6;
  runtime_error *prVar7;
  char *in_RDX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  start_00;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::_List_iterator<argparse::Argument>_>_>_>
  *__const_this;
  ulong uVar8;
  _List_node_base *p_Var9;
  string_view aName;
  string tHypotheticalArgument;
  
  __str = (aArguments->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (((this->mProgramName)._M_string_length == 0) &&
     (__str != (aArguments->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->mProgramName,__str);
    __str = (aArguments->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    in_RDX = extraout_RDX;
  }
  end._M_current =
       (aArguments->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  p_Var1 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
  start._M_current = __str + 1;
  p_Var9 = (this->mPositionalArguments).
           super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node
           .super__List_node_base._M_next;
  while( true ) {
    while( true ) {
      while( true ) {
        start_00._M_current = start._M_current;
        if (start_00._M_current == end._M_current) {
          this->mIsParsed = true;
          return;
        }
        aName._M_str = in_RDX;
        aName._M_len = (size_t)((start_00._M_current)->_M_dataplus)._M_p;
        bVar4 = Argument::is_positional((Argument *)(start_00._M_current)->_M_string_length,aName);
        if (!bVar4) break;
        if (p_Var9 == (_List_node_base *)&this->mPositionalArguments) {
          prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar7,"Maximum number of positional arguments exceeded");
          goto LAB_001357ec;
        }
        p_Var3 = p_Var9->_M_next;
        start = Argument::
                consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                          ((Argument *)(p_Var9 + 1),start_00,end,(string_view)ZEXT816(0));
        in_RDX = extraout_RDX_03;
        p_Var9 = p_Var3;
      }
      cVar5 = std::
              _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
              ::_M_find_tr<std::__cxx11::string,void>
                        ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                          *)&this->mArgumentMap,start_00._M_current);
      if ((_Rb_tree_header *)cVar5._M_node == p_Var1) break;
      start = Argument::
              consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((Argument *)&(cVar5._M_node[1]._M_left)->_M_left,start_00._M_current + 1,
                         end,*(string_view *)(cVar5._M_node + 1));
      in_RDX = extraout_RDX_01;
    }
    uVar6 = (start_00._M_current)->_M_string_length;
    if (((uVar6 < 2) || (pcVar2 = ((start_00._M_current)->_M_dataplus)._M_p, *pcVar2 != '-')) ||
       (pcVar2[1] == '-')) break;
    start._M_current = start_00._M_current + 1;
    in_RDX = extraout_RDX_00;
    for (uVar8 = 1; uVar8 < uVar6; uVar8 = uVar8 + 1) {
      tHypotheticalArgument._M_dataplus._M_p = (pointer)&tHypotheticalArgument.field_2;
      tHypotheticalArgument.field_2._M_allocated_capacity._0_2_ =
           (ushort)(byte)((start_00._M_current)->_M_dataplus)._M_p[uVar8] << 8 | 0x2d;
      tHypotheticalArgument._M_string_length = 2;
      tHypotheticalArgument.field_2._M_local_buf[2] = '\0';
      cVar5 = std::
              _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
              ::_M_find_tr<std::__cxx11::string,void>
                        ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>,std::less<void>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::_List_iterator<argparse::Argument>>>>
                          *)&this->mArgumentMap,&tHypotheticalArgument);
      if ((_Rb_tree_header *)cVar5._M_node == p_Var1) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"Unknown argument");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      start = Argument::
              consume<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                        ((Argument *)&(cVar5._M_node[1]._M_left)->_M_left,start,end,
                         *(string_view *)(cVar5._M_node + 1));
      std::__cxx11::string::~string((string *)&tHypotheticalArgument);
      uVar6 = (start_00._M_current)->_M_string_length;
      in_RDX = extraout_RDX_02;
    }
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"Unknown argument");
LAB_001357ec:
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_args_internal(const std::vector<std::string> &aArguments) {
            if (mProgramName.empty() && !aArguments.empty()) {
                mProgramName = aArguments.front();
            }
            auto end = std::end(aArguments);
            auto positionalArgumentIt = std::begin(mPositionalArguments);
            for (auto it = std::next(std::begin(aArguments)); it != end;) {
                const auto &tCurrentArgument = *it;
                if (Argument::is_positional(tCurrentArgument)) {
                    if (positionalArgumentIt == std::end(mPositionalArguments)) {
                        throw std::runtime_error(
                                "Maximum number of positional arguments exceeded");
                    }
                    auto tArgument = positionalArgumentIt++;
                    it = tArgument->consume(it, end);
                    continue;
                }

                auto tIterator = mArgumentMap.find(tCurrentArgument);
                if (tIterator != mArgumentMap.end()) {
                    auto tArgument = tIterator->second;
                    it = tArgument->consume(std::next(it), end, tIterator->first);
                } else if (const auto &tCompoundArgument = tCurrentArgument;
                        tCompoundArgument.size() > 1 && tCompoundArgument[0] == '-' &&
                        tCompoundArgument[1] != '-') {
                    ++it;
                    for (std::size_t j = 1; j < tCompoundArgument.size(); j++) {
                        auto tHypotheticalArgument = std::string{'-', tCompoundArgument[j]};
                        auto tIterator2 = mArgumentMap.find(tHypotheticalArgument);
                        if (tIterator2 != mArgumentMap.end()) {
                            auto tArgument = tIterator2->second;
                            it = tArgument->consume(it, end, tIterator2->first);
                        } else {
                            throw std::runtime_error("Unknown argument");
                        }
                    }
                } else {
                    throw std::runtime_error("Unknown argument");
                }
            }
            mIsParsed = true;
        }